

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmdevice.cpp
# Opt level: O0

void __thiscall
QEglFSKmsGbmDevice::createGlobalCursor(QEglFSKmsGbmDevice *this,QEglFSKmsGbmScreen *screen)

{
  long lVar1;
  bool bVar2;
  QKmsScreenConfig *this_00;
  char16_t *pcVar3;
  char *in_RSI;
  QKmsDevice *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffa8;
  QKmsDevice *this_01;
  char local_38 [24];
  QEglFSKmsGbmScreen *in_stack_ffffffffffffffe0;
  QEglFSKmsGbmCursor *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[1].m_path.d.ptr == (char16_t *)0x0) {
    this_01 = in_RDI;
    this_00 = QKmsDevice::screenConfig(in_RDI);
    bVar2 = QKmsScreenConfig::hwCursor(this_00);
    if (bVar2) {
      this_02 = (QEglFSKmsGbmCursor *)0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::qLcEglfsKmsDebug();
      anon_unknown.dwarf_4e05c::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,in_stack_ffffffffffffffa8);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffe8), bVar2) {
        anon_unknown.dwarf_4e05c::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x1187e4);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_01,in_RSI,(int)((ulong)in_RDI >> 0x20),
                   (char *)in_stack_ffffffffffffffa8,(char *)0x1187fa);
        QMessageLogger::debug(local_38,"Creating new global GBM mouse cursor");
      }
      pcVar3 = (char16_t *)operator_new(0xa8);
      QEglFSKmsGbmCursor::QEglFSKmsGbmCursor(this_02,in_stack_ffffffffffffffe0);
      in_RDI[1].m_path.d.ptr = pcVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmDevice::createGlobalCursor(QEglFSKmsGbmScreen *screen)
{
    if (!m_globalCursor && screenConfig()->hwCursor()) {
        qCDebug(qLcEglfsKmsDebug, "Creating new global GBM mouse cursor");
        m_globalCursor = new QEglFSKmsGbmCursor(screen);
    }
}